

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.h
# Opt level: O2

vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
* __thiscall
spvtools::opt::ConstantFoldingRules::GetRulesForInstruction
          (ConstantFoldingRules *this,Instruction *inst)

{
  uint32_t uVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  Op local_24;
  key_type local_20;
  
  local_24 = inst->opcode_;
  if (local_24 == OpExtInst) {
    uVar1 = Instruction::GetSingleWordInOperand(inst,0);
    local_20.opcode = Instruction::GetSingleWordInOperand(inst,1);
    local_20.instruction_set = uVar1;
    cVar2 = std::
            _Rb_tree<spvtools::opt::ConstantFoldingRules::Key,_std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>,_std::_Select1st<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
            ::find(&(this->ext_rules_)._M_t,&local_20);
    if ((_Rb_tree_header *)cVar2._M_node != &(this->ext_rules_)._M_t._M_impl.super__Rb_tree_header)
    {
      return (vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
              *)&cVar2._M_node[1]._M_parent;
    }
  }
  else {
    cVar3 = std::
            _Hashtable<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->rules_)._M_h,&local_24);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
        ._M_cur != (__node_type *)0x0) {
      return (vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
              *)((long)cVar3.
                       super__Node_iterator_base<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_false>
                       ._M_cur + 0x10);
    }
  }
  return &this->empty_vector_;
}

Assistant:

const std::vector<ConstantFoldingRule>& GetRulesForInstruction(
      const Instruction* inst) const {
    if (inst->opcode() != spv::Op::OpExtInst) {
      auto it = rules_.find(inst->opcode());
      if (it != rules_.end()) {
        return it->second.value;
      }
    } else {
      uint32_t ext_inst_id = inst->GetSingleWordInOperand(0);
      uint32_t ext_opcode = inst->GetSingleWordInOperand(1);
      auto it = ext_rules_.find({ext_inst_id, ext_opcode});
      if (it != ext_rules_.end()) {
        return it->second.value;
      }
    }
    return empty_vector_;
  }